

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint32_t n;
  uint uVar1;
  scoped_padder p;
  scoped_padder local_40;
  
  n = getpid();
  uVar1 = ::fmt::v6::internal::count_digits(n);
  scoped_padder::scoped_padder(&local_40,(ulong)uVar1,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<unsigned_int>(n,dest);
  scoped_padder::~scoped_padder(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = fmt_helper::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }